

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

SRes LzmaEnc_MemEncode(CLzmaEncHandle p,Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,
                      int writeEndMark,ICompressProgressPtr progress,ISzAllocPtr alloc,
                      ISzAllocPtr allocBig)

{
  SRes SVar1;
  SRes SVar2;
  ISeqOutStream_ local_38;
  Byte *local_30;
  SizeT local_28;
  int local_20;
  
  local_38.Write = SeqOutStreamBuf_Write;
  local_28 = *destLen;
  local_20 = 0;
  p->writeEndMark = writeEndMark;
  (p->rc).outStream = &local_38;
  (p->matchFinderBase).stream = (ISeqInStreamPtr)0x0;
  (p->matchFinderBase).directInput = '\x01';
  (p->matchFinderBase).buffer = src;
  (p->matchFinderBase).directInputRem = srcLen;
  (p->matchFinderBase).expectedDataSize = srcLen;
  local_30 = dest;
  SVar1 = LzmaEnc_AllocAndInit(p,0,alloc,allocBig);
  if (SVar1 == 0) {
    SVar1 = LzmaEnc_Encode2(p,progress);
    if ((SVar1 == 0) && (SVar1 = 0xb, p->nowPos64 == srcLen)) {
      SVar1 = 0;
    }
  }
  *destLen = *destLen - local_28;
  SVar2 = 7;
  if (local_20 == 0) {
    SVar2 = SVar1;
  }
  return SVar2;
}

Assistant:

SRes LzmaEnc_MemEncode(CLzmaEncHandle p, Byte *dest, SizeT *destLen, const Byte *src, SizeT srcLen,
    int writeEndMark, ICompressProgressPtr progress, ISzAllocPtr alloc, ISzAllocPtr allocBig)
{
  SRes res;
  // GET_CLzmaEnc_p

  CLzmaEnc_SeqOutStreamBuf outStream;

  outStream.vt.Write = SeqOutStreamBuf_Write;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = writeEndMark;
  p->rc.outStream = &outStream.vt;

  res = LzmaEnc_MemPrepare(p, src, srcLen, 0, alloc, allocBig);
  
  if (res == SZ_OK)
  {
    res = LzmaEnc_Encode2(p, progress);
    if (res == SZ_OK && p->nowPos64 != srcLen)
      res = SZ_ERROR_FAIL;
  }

  *destLen -= (SizeT)outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;
  return res;
}